

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_abs_i32_tricore(TCGContext_conflict9 *tcg_ctx,TCGv_i32 ret,TCGv_i32 a)

{
  TCGTemp *ts;
  TCGOp *pTVar1;
  uintptr_t o;
  uintptr_t o_1;
  
  ts = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
  tcg_gen_sari_i32_tricore(tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),a,0x1f);
  pTVar1 = tcg_emit_op_tricore(tcg_ctx,INDEX_op_xor_i32);
  pTVar1->args[0] = (TCGArg)(ret + (long)&tcg_ctx->pool_cur);
  pTVar1->args[1] = (TCGArg)(a + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)ts;
  tcg_gen_sub_i32(tcg_ctx,ret,ret,(TCGv_i32)((long)ts - (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,ts);
  return;
}

Assistant:

void tcg_gen_abs_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 a)
{
    TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_sari_i32(tcg_ctx, t, a, 31);
    tcg_gen_xor_i32(tcg_ctx, ret, a, t);
    tcg_gen_sub_i32(tcg_ctx, ret, ret, t);
    tcg_temp_free_i32(tcg_ctx, t);
}